

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O1

void For_ManFileExperiment(void)

{
  int iVar1;
  void *__ptr;
  FILE *pFVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  timespec ts;
  timespec local_30;
  
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  lVar6 = 0;
  printf("2^%d machine words (%d bytes).\n",0x19,0x8000000);
  iVar1 = 0x8000000;
  __ptr = malloc(0x8000000);
  do {
    *(int *)((long)__ptr + lVar6 * 4) = (int)lVar6;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x2000000);
  Abc_Print(iVar1,"%s =","Fillup");
  iVar5 = 3;
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar6 + lVar3) / 1000000.0);
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  pFVar2 = fopen("test.txt","rb");
  lVar6 = 1;
  fread(__ptr,1,0x8000000,pFVar2);
  fclose(pFVar2);
  Abc_Print((int)pFVar2,"%s =","Read  ");
  iVar5 = 3;
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  iVar1 = clock_gettime(3,&local_30);
  if (-1 < iVar1) {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar6 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  pFVar2 = fopen("test.txt","wb");
  fwrite(__ptr,1,0x8000000,pFVar2);
  fclose(pFVar2);
  Abc_Print((int)pFVar2,"%s =","Write ");
  iVar5 = 3;
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar3 + lVar6) / 1000000.0);
  return;
}

Assistant:

void For_ManFileExperiment()
{
    FILE * pFile;
    int * pBuffer;
    int i, Size, Exp = 25;
    abctime clk = Abc_Clock();
    int RetValue;

    Size = (1 << Exp);
    printf( "2^%d machine words (%d bytes).\n", Exp, (int)sizeof(int) * Size );

    pBuffer = ABC_ALLOC( int, Size );
    for ( i = 0; i < Size; i++ )
        pBuffer[i] = i;
ABC_PRT( "Fillup", Abc_Clock() - clk );

clk = Abc_Clock();
    pFile = fopen( "test.txt", "rb" );
    RetValue = fread( pBuffer, 1, sizeof(int) * Size, pFile );
    fclose( pFile );
ABC_PRT( "Read  ", Abc_Clock() - clk );

clk = Abc_Clock();
    pFile = fopen( "test.txt", "wb" );
    fwrite( pBuffer, 1, sizeof(int) * Size, pFile );
    fclose( pFile );
ABC_PRT( "Write ", Abc_Clock() - clk );
/*
2^25 machine words (134217728 bytes).
Fillup =    0.06 sec
Read   =    0.08 sec
Write  =    1.81 sec
*/
}